

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qspinbox.cpp
# Opt level: O1

QVariant * __thiscall
QSpinBoxPrivate::validateAndInterpret
          (QVariant *__return_storage_ptr__,QSpinBoxPrivate *this,QString *input,int *pos,
          State *state)

{
  QLocale *pQVar1;
  long lVar2;
  QArrayData *pQVar3;
  char16_t *pcVar4;
  undefined1 *puVar5;
  qsizetype qVar6;
  char cVar7;
  int iVar8;
  int iVar9;
  State SVar10;
  uint uVar11;
  ulong uVar12;
  long lVar13;
  int iVar14;
  QVariant *this_00;
  long in_FS_OFFSET;
  QStringView QVar15;
  QStringView QVar16;
  QStringView QVar17;
  QStringView QVar18;
  QStringView QVar19;
  QStringView QVar20;
  QStringView QVar21;
  QLatin1String QVar22;
  QLatin1String QVar23;
  bool ok;
  QStringBuilder<const_QString_&,_const_QString_&> local_b8;
  storage_type_conflict *local_a8;
  QStringBuilder<QStringBuilder<const_QString_&,_QString_&>,_const_QString_&> local_98;
  bool local_79;
  QString local_78;
  anon_union_24_3_e3d07ef4_for_data local_58;
  long local_38;
  
  local_38 = *(long *)(in_FS_OFFSET + 0x28);
  lVar13 = (this->super_QAbstractSpinBoxPrivate).cachedText.d.size;
  lVar2 = (input->d).size;
  if (((lVar13 == lVar2) &&
      (QVar15.m_data = (this->super_QAbstractSpinBoxPrivate).cachedText.d.ptr,
      QVar15.m_size = lVar13, QVar21.m_data = (input->d).ptr, QVar21.m_size = lVar2,
      cVar7 = QtPrivate::equalStrings(QVar15,QVar21), lVar2 != 0)) && (cVar7 != '\0')) {
    *state = (this->super_QAbstractSpinBoxPrivate).cachedState;
    if (*(long *)(in_FS_OFFSET + 0x28) == local_38) {
      ::QVariant::QVariant
                (__return_storage_ptr__,&(this->super_QAbstractSpinBoxPrivate).cachedValue);
      return __return_storage_ptr__;
    }
    goto LAB_00486a10;
  }
  iVar8 = ::QVariant::toInt((bool *)&(this->super_QAbstractSpinBoxPrivate).maximum);
  iVar9 = ::QVariant::toInt((bool *)&(this->super_QAbstractSpinBoxPrivate).minimum);
  local_78.d.size = (qsizetype)&DAT_aaaaaaaaaaaaaaaa;
  local_78.d.d = (Data *)&DAT_aaaaaaaaaaaaaaaa;
  local_78.d.ptr = (char16_t *)&DAT_aaaaaaaaaaaaaaaa;
  QAbstractSpinBoxPrivate::stripped(&local_78,&this->super_QAbstractSpinBoxPrivate,input,pos);
  qVar6 = local_78.d.size;
  *state = Acceptable;
  iVar14 = iVar9;
  if ((iVar8 == iVar9) ||
     ((((storage_type_conflict *)local_78.d.size != (storage_type_conflict *)0x0 &&
       (((storage_type_conflict *)local_78.d.size != (storage_type_conflict *)0x1 || -1 < iVar9 ||
        (QVar16.m_data = local_78.d.ptr, QVar16.m_size = local_78.d.size, QVar22.m_data = "-",
        QVar22.m_size = 1, cVar7 = QtPrivate::equalStrings(QVar16,QVar22), cVar7 == '\0')))) &&
      (((storage_type_conflict *)qVar6 != (storage_type_conflict *)0x1 || iVar8 < 0 ||
       (QVar17.m_data = local_78.d.ptr, QVar17.m_size = qVar6, QVar23.m_data = "+",
       QVar23.m_size = 1, cVar7 = QtPrivate::equalStrings(QVar17,QVar23), cVar7 == '\0')))))) {
    cVar7 = QString::startsWith((QChar)(char16_t)&local_78,0x2d);
    if ((iVar9 < 0) || (cVar7 == '\0')) {
      local_79 = false;
      iVar14 = *(int *)&(this->super_QAbstractSpinBoxPrivate).field_0x3d4;
      if (iVar14 == 10) {
        pQVar1 = &(this->super_QAbstractSpinBoxPrivate).super_QWidgetPrivate.locale;
        QVar18.m_data = (storage_type_conflict *)local_78.d.size;
        QVar18.m_size = (qsizetype)pQVar1;
        uVar12 = QLocale::toInt(QVar18,(bool *)local_78.d.ptr);
        uVar12 = uVar12 & 0xffffffff;
        if ((local_79 != false) || (iVar8 < 1000 && -1000 < iVar9)) goto LAB_004867f4;
        local_58._16_8_ = &DAT_aaaaaaaaaaaaaaaa;
        local_58.shared = (PrivateShared *)&DAT_aaaaaaaaaaaaaaaa;
        local_58._8_8_ = &DAT_aaaaaaaaaaaaaaaa;
        QLocale::groupSeparator();
        local_98.b = (QString *)&DAT_aaaaaaaaaaaaaaaa;
        local_98.a.a = (QString *)&DAT_aaaaaaaaaaaaaaaa;
        local_98.a.b = (QString *)&DAT_aaaaaaaaaaaaaaaa;
        local_b8.a = (QString *)&local_58;
        local_b8.b = (QString *)&local_58;
        QStringBuilder<const_QString_&,_const_QString_&>::convertTo<QString>
                  ((QString *)&local_98,&local_b8);
        lVar13 = QString::indexOf((QString *)&local_78,(longlong)&local_58,CaseInsensitive);
        if ((lVar13 != -1) &&
           (lVar13 = QString::indexOf((QString *)&local_78,(longlong)&local_98,CaseInsensitive),
           lVar13 == -1)) {
          local_b8.a = (QString *)local_78.d.d;
          local_b8.b = (QString *)local_78.d.ptr;
          local_a8 = (storage_type_conflict *)local_78.d.size;
          if ((anon_union_24_3_e3d07ef4_for_data *)local_78.d.d !=
              (anon_union_24_3_e3d07ef4_for_data *)0x0) {
            LOCK();
            *(int *)local_78.d.d = *(int *)local_78.d.d + 1;
            UNLOCK();
          }
          QString::remove((QString *)&local_b8,(CaseSensitivity)&local_58);
          QVar20.m_data = local_a8;
          QVar20.m_size = (qsizetype)pQVar1;
          uVar11 = QLocale::toInt(QVar20,(bool *)local_b8.b);
          uVar12 = (ulong)uVar11;
          if ((anon_union_24_3_e3d07ef4_for_data *)local_b8.a !=
              (anon_union_24_3_e3d07ef4_for_data *)0x0) {
            LOCK();
            *(int *)local_b8.a = *(int *)local_b8.a + -1;
            UNLOCK();
            if (*(int *)local_b8.a == 0) {
              QArrayData::deallocate((QArrayData *)local_b8.a,2,0x10);
            }
          }
        }
        iVar14 = (int)uVar12;
        if ((QArrayData *)local_98.a.a != (QArrayData *)0x0) {
          LOCK();
          (((QBasicAtomicInt *)&(local_98.a.a)->d)->_q_value).super___atomic_base<int>._M_i =
               (((QBasicAtomicInt *)&(local_98.a.a)->d)->_q_value).super___atomic_base<int>._M_i +
               -1;
          UNLOCK();
          if ((((QBasicAtomicInt *)&(local_98.a.a)->d)->_q_value).super___atomic_base<int>._M_i == 0
             ) {
            QArrayData::deallocate((QArrayData *)local_98.a.a,2,0x10);
          }
        }
        if ((QArrayData *)local_58.shared != (QArrayData *)0x0) {
          LOCK();
          *(int *)local_58.shared = *(int *)local_58.shared + -1;
          UNLOCK();
          if (*(int *)local_58.shared == 0) {
            QArrayData::deallocate((QArrayData *)local_58.shared,2,0x10);
            goto LAB_004867f4;
          }
        }
      }
      else {
        QVar19.m_data = local_78.d.ptr;
        QVar19.m_size = local_78.d.size;
        uVar12 = QString::toIntegral_helper(QVar19,&local_79,iVar14);
        if ((long)(int)uVar12 != uVar12) {
          local_79 = false;
          uVar12 = 0;
        }
LAB_004867f4:
        iVar14 = (int)uVar12;
      }
      SVar10 = Invalid;
      if (local_79 == true) {
        SVar10 = (uint)(iVar14 <= iVar8 && iVar9 <= iVar14) * 2;
        if ((iVar8 != iVar9) && (iVar14 > iVar8 || iVar9 > iVar14)) {
          SVar10 = (State)((-1 < iVar14 || iVar9 <= iVar14) && (-1 >= iVar14 || iVar14 <= iVar8));
        }
      }
      *state = SVar10;
    }
    else {
      *state = Invalid;
    }
  }
  else {
    *state = Intermediate;
  }
  if (iVar8 < 1) {
    iVar9 = iVar8;
  }
  if (*state == Acceptable) {
    iVar9 = iVar14;
  }
  local_98.a.a = &(this->super_QAbstractSpinBoxPrivate).prefix;
  local_98.b = &(this->super_QAbstractSpinBoxPrivate).suffix;
  local_98.a.b = &local_78;
  QStringBuilder<QStringBuilder<const_QString_&,_QString_&>,_const_QString_&>::convertTo<QString>
            ((QString *)&local_58,&local_98);
  pQVar3 = &((input->d).d)->super_QArrayData;
  pcVar4 = (input->d).ptr;
  (input->d).d = (Data *)local_58.shared;
  (input->d).ptr = (char16_t *)local_58._8_8_;
  puVar5 = (undefined1 *)(input->d).size;
  (input->d).size = local_58._16_8_;
  local_58.shared = (PrivateShared *)pQVar3;
  local_58._8_8_ = pcVar4;
  local_58._16_8_ = puVar5;
  if (pQVar3 != (QArrayData *)0x0) {
    LOCK();
    (pQVar3->ref_)._q_value.super___atomic_base<int>._M_i =
         (pQVar3->ref_)._q_value.super___atomic_base<int>._M_i + -1;
    UNLOCK();
    if ((pQVar3->ref_)._q_value.super___atomic_base<int>._M_i == 0) {
      QArrayData::deallocate(pQVar3,2,0x10);
    }
  }
  QString::operator=(&(this->super_QAbstractSpinBoxPrivate).cachedText,(QString *)input);
  (this->super_QAbstractSpinBoxPrivate).cachedState = *state;
  ::QVariant::QVariant((QVariant *)&local_58,iVar9);
  this_00 = &(this->super_QAbstractSpinBoxPrivate).cachedValue;
  ::QVariant::operator=(this_00,(QVariant *)&local_58);
  ::QVariant::~QVariant((QVariant *)&local_58);
  ::QVariant::QVariant(__return_storage_ptr__,this_00);
  if ((anon_union_24_3_e3d07ef4_for_data *)local_78.d.d != (anon_union_24_3_e3d07ef4_for_data *)0x0)
  {
    LOCK();
    *(int *)local_78.d.d = *(int *)local_78.d.d + -1;
    UNLOCK();
    if (*(int *)local_78.d.d == 0) {
      QArrayData::deallocate(&(local_78.d.d)->super_QArrayData,2,0x10);
    }
  }
  if (*(long *)(in_FS_OFFSET + 0x28) == local_38) {
    return __return_storage_ptr__;
  }
LAB_00486a10:
  __stack_chk_fail();
}

Assistant:

QVariant QSpinBoxPrivate::validateAndInterpret(QString &input, int &pos,
                                               QValidator::State &state) const
{
    if (cachedText == input && !input.isEmpty()) {
        state = cachedState;
        QSBDEBUG() << "cachedText was '" << cachedText << "' state was "
                   << state << " and value was " << cachedValue;

        return cachedValue;
    }
    const int max = maximum.toInt();
    const int min = minimum.toInt();

    QString copy = stripped(input, &pos);
    QSBDEBUG() << "input" << input << "copy" << copy;
    state = QValidator::Acceptable;
    int num = min;

    if (max != min && (copy.isEmpty()
                       || (min < 0 && copy == "-"_L1)
                       || (max >= 0 && copy == "+"_L1))) {
        state = QValidator::Intermediate;
        QSBDEBUG() << __FILE__ << __LINE__<< "num is set to" << num;
    } else if (copy.startsWith(u'-') && min >= 0) {
        state = QValidator::Invalid; // special-case -0 will be interpreted as 0 and thus not be invalid with a range from 0-100
    } else {
        bool ok = false;
        if (displayIntegerBase != 10) {
            num = copy.toInt(&ok, displayIntegerBase);
        } else {
            num = locale.toInt(copy, &ok);
            if (!ok && (max >= 1000 || min <= -1000)) {
                const QString sep(locale.groupSeparator());
                const QString doubleSep = sep + sep;
                if (copy.contains(sep) && !copy.contains(doubleSep)) {
                    QString copy2 = copy;
                    copy2.remove(sep);
                    num = locale.toInt(copy2, &ok);
                }
            }
        }
        QSBDEBUG() << __FILE__ << __LINE__<< "num is set to" << num;
        if (!ok) {
            state = QValidator::Invalid;
        } else if (num >= min && num <= max) {
            state = QValidator::Acceptable;
        } else if (max == min) {
            state = QValidator::Invalid;
        } else {
            if ((num >= 0 && num > max) || (num < 0 && num < min)) {
                state = QValidator::Invalid;
                QSBDEBUG() << __FILE__ << __LINE__<< "state is set to Invalid";
            } else {
                state = QValidator::Intermediate;
                QSBDEBUG() << __FILE__ << __LINE__<< "state is set to Intermediate";
            }
        }
    }
    if (state != QValidator::Acceptable)
        num = max > 0 ? min : max;
    input = prefix + copy + suffix;
    cachedText = input;
    cachedState = state;
    cachedValue = QVariant((int)num);

    QSBDEBUG() << "cachedText is set to '" << cachedText << "' state is set to "
               << state << " and value is set to " << cachedValue;
    return cachedValue;
}